

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 sVar1;
  int iVar2;
  stbi__uint16 *psVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  stbi__uint16 *psVar8;
  ulong uVar9;
  stbi__uint16 *psVar10;
  long lVar11;
  stbi__result_info ri;
  stbi__context s;
  stbi__uint16 *local_130;
  stbi__result_info local_114;
  stbi__context local_108;
  
  stbi__start_file(&local_108,f);
  psVar3 = (stbi__uint16 *)stbi__load_main(&local_108,x,y,comp,req_comp,&local_114,0x10);
  if (psVar3 != (stbi__uint16 *)0x0) {
    if (local_114.bits_per_channel == 8) {
      iVar4 = req_comp;
      if (req_comp == 0) {
        iVar4 = *comp;
      }
      uVar6 = *y * *x * iVar4;
      local_130 = (stbi__uint16 *)malloc((long)(int)(uVar6 * 2));
      if (local_130 == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
        local_130 = (stbi__uint16 *)0x0;
      }
      else {
        if (0 < (int)uVar6) {
          uVar7 = 0;
          do {
            local_130[uVar7] =
                 CONCAT11(*(undefined1 *)((long)psVar3 + uVar7),
                          *(undefined1 *)((long)psVar3 + uVar7));
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        free(psVar3);
      }
    }
    else {
      local_130 = psVar3;
      if (local_114.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_image.h"
                      ,0x436,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar6 = *y >> 1;
      if (0 < (int)uVar6) {
        iVar4 = *x;
        lVar5 = (long)req_comp;
        iVar2 = (*y + -1) * iVar4;
        uVar7 = 0;
        psVar3 = local_130;
        do {
          if (0 < iVar4) {
            psVar8 = (stbi__uint16 *)((long)iVar2 * lVar5 * 2 + (long)local_130);
            lVar11 = 0;
            psVar10 = psVar3;
            do {
              if (0 < req_comp) {
                uVar9 = 0;
                do {
                  sVar1 = psVar10[uVar9];
                  psVar10[uVar9] = psVar8[uVar9];
                  psVar8[uVar9] = sVar1;
                  uVar9 = uVar9 + 1;
                } while ((uint)req_comp != uVar9);
              }
              lVar11 = lVar11 + 1;
              psVar8 = psVar8 + lVar5;
              psVar10 = psVar10 + lVar5;
            } while (lVar11 != iVar4);
          }
          uVar7 = uVar7 + 1;
          iVar2 = iVar2 - iVar4;
          psVar3 = psVar3 + lVar5 * iVar4;
        } while (uVar7 != uVar6);
      }
    }
    if (local_130 != (stbi__uint16 *)0x0) {
      fseek((FILE *)f,(long)((int)local_108.img_buffer - (int)local_108.img_buffer_end),1);
      return local_130;
    }
  }
  return (stbi__uint16 *)0x0;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}